

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

TestCase * TestCharReaderFailIfExtraTestissue107::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  (((CharReaderFailIfExtraTest *)&this->_vptr_TestCase)->super_TestCase)._vptr_TestCase =
       (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  TestCharReaderFailIfExtraTestissue107((TestCharReaderFailIfExtraTestissue107 *)this);
  return this;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, issue107) {
  // This is interpretted as an int value followed by a colon.
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "1:2:3";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(
      "* Line 1, Column 2\n"
      "  Extra non-whitespace after JSON value.\n",
      errs);
  JSONTEST_ASSERT_EQUAL(1, root.asInt());
  delete reader;
}